

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              int *cost_list,FULLPEL_MV *best_mv,FULLPEL_MV_STATS *best_mv_stats,
              FULLPEL_MV *second_best_mv)

{
  SEARCH_METHODS SVar1;
  short sVar2;
  short sVar3;
  search_site_config *psVar4;
  aom_sad_fn_t p_Var5;
  buf_2d *pbVar6;
  buf_2d *pbVar7;
  MESH_PATTERN *pMVar8;
  ushort uVar9;
  uint *puVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ushort uVar19;
  uint uVar20;
  FULLPEL_MV FVar21;
  FULLPEL_MV mv;
  int i;
  uint8_t *puVar22;
  uint8_t *puVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  short local_190;
  int local_18c;
  FULLPEL_MV tmp_mv_ex;
  FULLPEL_MV tmp_best_mv;
  short local_15c;
  int num00;
  FULLPEL_MV local_14c;
  uint *local_148;
  FULLPEL_MV local_13c;
  MV_COST_PARAMS *local_138;
  int local_12c;
  ulong local_128;
  long local_120;
  FullMvLimits *local_118;
  FULLPEL_MV_STATS tmp_mv_stats;
  
  local_128 = (ulong)ms_params->bsize;
  SVar1 = ms_params->search_method;
  lVar24 = (long)ms_params->is_intra_mode;
  uVar17 = ms_params->run_mesh_search;
  best_mv->row = -0x8000;
  best_mv->col = -0x8000;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    second_best_mv->row = -0x8000;
    second_best_mv->col = -0x8000;
  }
  if (cost_list != (int *)0x0) {
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
    cost_list[4] = 0x7fffffff;
  }
  iVar16 = 9;
  local_148 = (uint *)cost_list;
  local_13c = start_mv;
  local_120 = lVar24;
  switch(SVar1) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
    psVar4 = ms_params->search_sites;
    num00 = 0;
    local_118 = &ms_params->mv_limits;
    local_14c = start_mv;
    clamp_fullmv(&local_14c,local_118);
    FVar21 = local_14c;
    tmp_mv_stats.err_cost._0_2_ = local_14c.row;
    tmp_mv_stats.err_cost._2_2_ = local_14c.col;
    pbVar6 = (ms_params->ms_buffers).ref;
    pbVar7 = (ms_params->ms_buffers).src;
    iVar16 = pbVar6->stride;
    puVar22 = pbVar6->buf + (((int)local_14c >> 0x10) + local_14c.row * iVar16);
    local_138 = &ms_params->mv_cost_params;
    iVar15 = mvsad_err_cost_((FULLPEL_MV *)&tmp_mv_stats,local_138);
    if ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0) {
      uVar14 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,puVar22,iVar16);
    }
    else {
      uVar14 = get_mvpred_compound_sad(ms_params,pbVar7,puVar22,iVar16);
    }
    diamond_search_sad(FVar21,uVar14 + iVar15,ms_params,step_param,(int *)&tmp_mv_ex,best_mv,
                       second_best_mv);
    local_18c = get_mvpred_compound_var_cost(ms_params,best_mv,best_mv_stats);
    iVar16 = psVar4->num_search_steps;
    while (cost_list = (int *)local_148, (int)tmp_mv_ex < ~step_param + iVar16) {
      diamond_search_sad(FVar21,uVar14 + iVar15,ms_params,step_param + (int)tmp_mv_ex + 1,&num00,
                         &tmp_best_mv,second_best_mv);
      iVar18 = get_mvpred_compound_var_cost(ms_params,&tmp_best_mv,&tmp_mv_stats);
      if (iVar18 < local_18c) {
        *best_mv = tmp_best_mv;
        best_mv_stats->sse = tmp_mv_stats.sse;
        best_mv_stats->err_cost = tmp_mv_stats.err_cost;
        best_mv_stats->distortion = tmp_mv_stats.distortion;
        local_18c = iVar18;
      }
      tmp_mv_ex = (FULLPEL_MV)((int)tmp_mv_ex + 1);
      if (num00 != 0) {
        tmp_mv_ex = (FULLPEL_MV)(num00 + (int)tmp_mv_ex);
        num00 = 0;
      }
    }
    lVar24 = local_120;
    start_mv = local_13c;
    if (local_148 != (uint *)0x0) {
      FVar21 = *best_mv;
      pbVar6 = (ms_params->ms_buffers).ref;
      pbVar7 = (ms_params->ms_buffers).src;
      iVar16 = pbVar6->stride;
      sVar11 = FVar21.row;
      local_12c = (int)sVar11;
      tmp_mv_stats.err_cost = (int)FVar21;
      uVar14 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                 pbVar6->buf + (iVar16 * local_12c + ((int)FVar21 >> 0x10)),iVar16);
      *cost_list = uVar14;
      iVar15 = check_bounds(local_118,local_12c,(int)FVar21 >> 0x10,1);
      lVar24 = 0;
      local_15c = FVar21.col;
      if (iVar15 == 0) {
        for (; lVar24 != 4; lVar24 = lVar24 + 1) {
          sVar2 = (&calc_int_sad_list_neighbors)[lVar24 * 2];
          sVar3 = (&DAT_0043ef72)[lVar24 * 2];
          FVar21.col = sVar3 + local_15c;
          FVar21.row = sVar2 + sVar11;
          iVar15 = av1_is_fullmv_in_range(local_118,FVar21);
          if (iVar15 == 0) {
            uVar14 = 0x7fffffff;
          }
          else {
            uVar14 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                       pbVar6->buf +
                                       ((int)(short)(sVar3 + local_15c) +
                                       (int)(short)(sVar2 + sVar11) * pbVar6->stride),iVar16);
          }
          local_148[lVar24 + 1] = uVar14;
          cost_list = (int *)local_148;
        }
      }
      else {
        for (; lVar24 != 4; lVar24 = lVar24 + 1) {
          uVar14 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                     pbVar6->buf +
                                     ((int)(short)((&DAT_0043ef72)[lVar24 * 2] + local_15c) +
                                     (int)(short)((&calc_int_sad_list_neighbors)[lVar24 * 2] +
                                                 sVar11) * pbVar6->stride),iVar16);
          ((uint *)cost_list)[lVar24 + 1] = uVar14;
        }
      }
      iVar16 = mvsad_err_cost_((FULLPEL_MV *)&tmp_mv_stats,local_138);
      *cost_list = *cost_list + iVar16;
      for (lVar25 = 0; lVar24 = local_120, start_mv = local_13c, lVar25 != 4; lVar25 = lVar25 + 1) {
        uVar14 = ((uint *)cost_list)[lVar25 + 1];
        if (uVar14 != 0x7fffffff) {
          tmp_best_mv.col = (&DAT_0043ef72)[lVar25 * 2] + local_15c;
          tmp_best_mv.row = (&calc_int_sad_list_neighbors)[lVar25 * 2] + sVar11;
          iVar16 = mvsad_err_cost_(&tmp_best_mv,local_138);
          ((uint *)cost_list)[lVar25 + 1] = iVar16 + uVar14;
        }
      }
    }
    goto LAB_001c7293;
  case '\x04':
  case '\x05':
  case '\x06':
    iVar15 = 1;
    iVar16 = step_param;
    goto LAB_001c727e;
  case '\a':
  case '\b':
    bVar26 = SBORROW4(step_param,10);
    iVar15 = step_param + -10;
    break;
  case '\t':
    bVar26 = SBORROW4(step_param,9);
    iVar15 = step_param + -9;
    iVar16 = 8;
    break;
  case '\n':
    bVar26 = SBORROW4(step_param,0xb);
    iVar15 = step_param + -0xb;
    iVar16 = 10;
    break;
  default:
    local_18c = 0;
    goto LAB_001c7293;
  }
  if (bVar26 == iVar15 < 0) {
    iVar16 = step_param;
  }
  iVar15 = 0;
LAB_001c727e:
  local_18c = pattern_search(start_mv,ms_params,iVar16,iVar15,cost_list,best_mv,best_mv_stats);
LAB_001c7293:
  if (((uVar17 == 0) && (uVar17 = 0, (byte)(SVar1 - 1) < 2)) &&
     ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0)) {
    uVar17 = (uint)(ms_params->force_mesh_thresh >> (10 - (""[local_128] + ""[local_128]) & 0x1f) <
                   local_18c);
  }
  if (((int)lVar24 == 0) && (ms_params->prune_mesh_search != 0)) {
    uVar13 = (int)start_mv.row - (int)best_mv->row;
    uVar14 = -uVar13;
    if (0 < (int)uVar13) {
      uVar14 = uVar13;
    }
    uVar20 = ((int)start_mv >> 0x10) - (int)best_mv->col;
    uVar13 = -uVar20;
    if (0 < (int)uVar20) {
      uVar13 = uVar20;
    }
    if (uVar13 < uVar14) {
      uVar13 = uVar14;
    }
    if ((int)uVar13 <= ms_params->mesh_search_mv_diff_threshold) {
      uVar17 = 0;
    }
  }
  p_Var5 = ms_params->vfp->sdf;
  if (ms_params->sdf != p_Var5) {
    pbVar6 = (ms_params->ms_buffers).ref;
    pbVar7 = (ms_params->ms_buffers).src;
    iVar16 = pbVar7->stride;
    iVar15 = pbVar6->stride;
    puVar22 = pbVar7->buf;
    puVar23 = pbVar6->buf + (long)best_mv->col + (long)best_mv->row * (long)iVar15;
    uVar14 = (*p_Var5)(puVar22,iVar16,puVar23,iVar15);
    lVar24 = local_120;
    cost_list = (int *)local_148;
    uVar13 = (*ms_params->vfp->sdsf)(puVar22,iVar16,puVar23,iVar15);
    if (1 << (""[local_128] + ""[local_128] & 0x1f) < (int)uVar14) {
      iVar15 = uVar13 - uVar14;
      iVar16 = -iVar15;
      if (0 < iVar15) {
        iVar16 = iVar15;
      }
      uVar13 = 1;
      if (1 < (int)uVar14) {
        uVar13 = uVar14;
      }
      if (uVar13 * 9 <= (uint)(iVar16 * 10)) {
        memcpy((FULLPEL_MOTION_SEARCH_PARAMS *)&tmp_mv_stats,ms_params,0xe0);
        iVar16 = av1_full_pixel_search
                           (local_13c,(FULLPEL_MOTION_SEARCH_PARAMS *)&tmp_mv_stats,step_param,
                            cost_list,best_mv,best_mv_stats,second_best_mv);
        return iVar16;
      }
    }
  }
  if (uVar17 != 0) {
    pMVar8 = ms_params->mesh_patterns[lVar24];
    tmp_mv_ex = *best_mv;
    uVar17 = pMVar8->range;
    uVar14 = pMVar8->interval;
    if (((0xffffff05 < uVar17 - 0x101) && (0 < (int)uVar14)) && ((int)uVar14 <= (int)uVar17)) {
      uVar12 = tmp_mv_ex.row;
      uVar9 = -uVar12;
      if (0 < (short)uVar12) {
        uVar9 = uVar12;
      }
      uVar19 = tmp_mv_ex.col;
      uVar12 = -uVar19;
      if (0 < (short)uVar19) {
        uVar12 = uVar19;
      }
      if (uVar12 < uVar9) {
        uVar12 = uVar9;
      }
      uVar13 = (uint)(uVar12 >> 2) + (uint)uVar12;
      if (uVar13 < uVar17) {
        uVar13 = uVar17;
      }
      uVar20 = 0x100;
      if (uVar13 < 0x100) {
        uVar20 = uVar13;
      }
      uVar17 = (uVar20 & 0xffff) / (uVar17 / uVar14 & 0xffff);
      if (uVar17 < uVar14) {
        uVar17 = uVar14;
      }
      uVar14 = 4;
      if (uVar17 < 4) {
        uVar14 = uVar17;
      }
      if (ms_params->fine_search_interval == 0) {
        uVar14 = uVar17;
      }
      iVar16 = exhaustive_mesh_search(tmp_mv_ex,ms_params,uVar20,uVar14,&tmp_mv_ex,second_best_mv);
      if ((7 < uVar13) && (1 < uVar14)) {
        lVar24 = 0;
        do {
          if (lVar24 == 3) break;
          iVar16 = exhaustive_mesh_search
                             (tmp_mv_ex,ms_params,pMVar8[lVar24 + 1].range,
                              pMVar8[lVar24 + 1].interval,&tmp_mv_ex,second_best_mv);
          lVar25 = lVar24 + 1;
          lVar24 = lVar24 + 1;
        } while (pMVar8[lVar25].interval != 1);
      }
      iVar15 = 0x7fffffff;
      if (iVar16 != 0x7fffffff) {
        iVar15 = get_mvpred_var_cost(ms_params,&tmp_mv_ex,&tmp_mv_stats);
      }
      FVar21 = tmp_mv_ex;
      if ((uint *)cost_list != (uint *)0x0) {
        tmp_best_mv = tmp_mv_ex;
        pbVar6 = (ms_params->ms_buffers).ref;
        pbVar7 = (ms_params->ms_buffers).src;
        iVar16 = pbVar6->stride;
        local_138 = (MV_COST_PARAMS *)CONCAT44(local_138._4_4_,(int)tmp_mv_ex >> 0x10);
        sVar11 = tmp_mv_ex.row;
        uVar17 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                   pbVar6->buf + (iVar16 * sVar11 + ((int)tmp_mv_ex >> 0x10)),iVar16
                                  );
        *cost_list = uVar17;
        iVar18 = check_bounds(&ms_params->mv_limits,(int)sVar11,(int)local_138,1);
        local_190 = FVar21.col;
        if (iVar18 == 0) {
          for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
            sVar2 = (&calc_int_sad_list_neighbors)[lVar24 * 2];
            sVar3 = (&DAT_0043ef72)[lVar24 * 2];
            mv.col = sVar3 + local_190;
            mv.row = sVar2 + sVar11;
            iVar18 = av1_is_fullmv_in_range(&ms_params->mv_limits,mv);
            if (iVar18 == 0) {
              uVar17 = 0x7fffffff;
            }
            else {
              uVar17 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                         pbVar6->buf +
                                         ((int)(short)(sVar3 + local_190) +
                                         (int)(short)(sVar2 + sVar11) * pbVar6->stride),iVar16);
            }
            local_148[lVar24 + 1] = uVar17;
          }
        }
        else {
          for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
            uVar17 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                       pbVar6->buf +
                                       ((int)(short)((&DAT_0043ef72)[lVar24 * 2] + local_190) +
                                       (int)(short)((&calc_int_sad_list_neighbors)[lVar24 * 2] +
                                                   sVar11) * pbVar6->stride),iVar16);
            local_148[lVar24 + 1] = uVar17;
          }
        }
        iVar16 = mvsad_err_cost_(&tmp_best_mv,&ms_params->mv_cost_params);
        puVar10 = local_148;
        *local_148 = *local_148 + iVar16;
        for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
          uVar17 = puVar10[lVar24 + 1];
          if (uVar17 != 0x7fffffff) {
            local_14c.col = (&DAT_0043ef72)[lVar24 * 2] + local_190;
            local_14c.row = (&calc_int_sad_list_neighbors)[lVar24 * 2] + sVar11;
            iVar16 = mvsad_err_cost_(&local_14c,&ms_params->mv_cost_params);
            puVar10[lVar24 + 1] = iVar16 + uVar17;
          }
        }
      }
      if (iVar15 < local_18c) {
        best_mv_stats->sse = tmp_mv_stats.sse;
        best_mv_stats->err_cost = tmp_mv_stats.err_cost;
        best_mv_stats->distortion = tmp_mv_stats.distortion;
        *best_mv = tmp_mv_ex;
        local_18c = iVar15;
      }
    }
  }
  return local_18c;
}

Assistant:

int av1_full_pixel_search(const FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          const int step_param, int *cost_list,
                          FULLPEL_MV *best_mv, FULLPEL_MV_STATS *best_mv_stats,
                          FULLPEL_MV *second_best_mv) {
  const BLOCK_SIZE bsize = ms_params->bsize;
  const SEARCH_METHODS search_method = ms_params->search_method;

  const int is_intra_mode = ms_params->is_intra_mode;
  int run_mesh_search = ms_params->run_mesh_search;

  int var = 0;
  MARK_MV_INVALID(best_mv);
  if (second_best_mv) {
    MARK_MV_INVALID(second_best_mv);
  }

  if (cost_list) {
    cost_list[0] = INT_MAX;
    cost_list[1] = INT_MAX;
    cost_list[2] = INT_MAX;
    cost_list[3] = INT_MAX;
    cost_list[4] = INT_MAX;
  }

  assert(ms_params->ms_buffers.ref->stride == ms_params->search_sites->stride);

  switch (search_method) {
    case FAST_BIGDIA:
      var = fast_bigdia_search(start_mv, ms_params, step_param, 0, cost_list,
                               best_mv, best_mv_stats);
      break;
    case VFAST_DIAMOND:
      var = vfast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                             best_mv, best_mv_stats);
      break;
    case FAST_DIAMOND:
      var = fast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case FAST_HEX:
      var = fast_hex_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case HEX:
      var = hex_search(start_mv, ms_params, step_param, 1, cost_list, best_mv,
                       best_mv_stats);
      break;
    case SQUARE:
      var = square_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case BIGDIA:
      var = bigdia_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case NSTEP:
    case NSTEP_8PT:
    case DIAMOND:
    case CLAMPED_DIAMOND:
      var = full_pixel_diamond(start_mv, ms_params, step_param, cost_list,
                               best_mv, best_mv_stats, second_best_mv);
      break;
    default: assert(0 && "Invalid search method.");
  }

  // Should we allow a follow on exhaustive search?
  if (!run_mesh_search &&
      ((search_method == NSTEP) || (search_method == NSTEP_8PT)) &&
      !ms_params->ms_buffers.second_pred) {
    int exhaustive_thr = ms_params->force_mesh_thresh;
    exhaustive_thr >>=
        10 - (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    // Threshold variance for an exhaustive full search.
    if (var > exhaustive_thr) run_mesh_search = 1;
  }

  // TODO(yunqing): the following is used to reduce mesh search in temporal
  // filtering. Can extend it to intrabc.
  if (!is_intra_mode && ms_params->prune_mesh_search) {
    const int full_pel_mv_diff = AOMMAX(abs(start_mv.row - best_mv->row),
                                        abs(start_mv.col - best_mv->col));
    if (full_pel_mv_diff <= ms_params->mesh_search_mv_diff_threshold) {
      run_mesh_search = 0;
    }
  }

  if (ms_params->sdf != ms_params->vfp->sdf) {
    // If we are skipping rows when we perform the motion search, we need to
    // check the quality of skipping. If it's bad, then we run mesh search with
    // skip row features off.
    // TODO(chiyotsai@google.com): Handle the case where we have a vertical
    // offset of 1 before we hit this statement to avoid having to redo
    // motion search.
    const struct buf_2d *src = ms_params->ms_buffers.src;
    const struct buf_2d *ref = ms_params->ms_buffers.ref;
    const int src_stride = src->stride;
    const int ref_stride = ref->stride;

    const uint8_t *src_address = src->buf;
    const uint8_t *best_address = get_buf_from_fullmv(ref, best_mv);
    const int sad =
        ms_params->vfp->sdf(src_address, src_stride, best_address, ref_stride);
    const int skip_sad =
        ms_params->vfp->sdsf(src_address, src_stride, best_address, ref_stride);
    // We will keep the result of skipping rows if it's good enough. Here, good
    // enough means the error is less than 1 per pixel.
    const int kSADThresh =
        1 << (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    if (sad > kSADThresh && abs(skip_sad - sad) * 10 >= AOMMAX(sad, 1) * 9) {
      // There is a large discrepancy between skipping and not skipping, so we
      // need to redo the motion search.
      FULLPEL_MOTION_SEARCH_PARAMS new_ms_params = *ms_params;
      new_ms_params.sdf = new_ms_params.vfp->sdf;
      new_ms_params.sdx4df = new_ms_params.vfp->sdx4df;
      new_ms_params.sdx3df = new_ms_params.vfp->sdx3df;

      return av1_full_pixel_search(start_mv, &new_ms_params, step_param,
                                   cost_list, best_mv, best_mv_stats,
                                   second_best_mv);
    }
  }

  if (run_mesh_search) {
    int var_ex;
    FULLPEL_MV tmp_mv_ex;
    FULLPEL_MV_STATS tmp_mv_stats;
    // Pick the mesh pattern for exhaustive search based on the toolset (intraBC
    // or non-intraBC)
    // TODO(chiyotsai@google.com):  There is a bug here where the second best mv
    // gets overwritten without actually comparing the rdcost.
    const MESH_PATTERN *const mesh_patterns =
        ms_params->mesh_patterns[is_intra_mode];
    // TODO(chiyotsai@google.com): the second best mv is not set correctly by
    // full_pixel_exhaustive, which can incorrectly override it.
    var_ex =
        full_pixel_exhaustive(*best_mv, ms_params, mesh_patterns, cost_list,
                              &tmp_mv_ex, &tmp_mv_stats, second_best_mv);
    if (var_ex < var) {
      var = var_ex;
      *best_mv_stats = tmp_mv_stats;
      *best_mv = tmp_mv_ex;
    }
  }

  return var;
}